

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.h
# Opt level: O0

void __thiscall
Eigen::SparseMatrix<double,_0,_int>::swap
          (SparseMatrix<double,_0,_int> *this,SparseMatrix<double,_0,_int> *other)

{
  SparseMatrix<double,_0,_int> *other_local;
  SparseMatrix<double,_0,_int> *this_local;
  
  std::swap<int*>(&this->m_outerIndex,&other->m_outerIndex);
  std::swap<int>(&this->m_innerSize,&other->m_innerSize);
  std::swap<int>(&this->m_outerSize,&other->m_outerSize);
  std::swap<int*>(&this->m_innerNonZeros,&other->m_innerNonZeros);
  internal::CompressedStorage<double,_int>::swap(&this->m_data,&other->m_data);
  return;
}

Assistant:

inline void swap(SparseMatrix& other)
    {
      //EIGEN_DBG_SPARSE(std::cout << "SparseMatrix:: swap\n");
      std::swap(m_outerIndex, other.m_outerIndex);
      std::swap(m_innerSize, other.m_innerSize);
      std::swap(m_outerSize, other.m_outerSize);
      std::swap(m_innerNonZeros, other.m_innerNonZeros);
      m_data.swap(other.m_data);
    }